

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_stat.cpp
# Opt level: O1

vector<long_double,_std::allocator<long_double>_> * __thiscall
csv::CSVStat::get_maxes
          (vector<long_double,_std::allocator<long_double>_> *__return_storage_ptr__,CSVStat *this)

{
  iterator __position;
  longdouble *__args;
  size_t i;
  ulong uVar1;
  long lVar2;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 0;
  uVar1 = 0;
  while( true ) {
    CSVReader::get_col_names_abi_cxx11_(&local_48,&this->reader);
    lVar3 = (long)local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((ulong)(lVar3 >> 5) <= uVar1) break;
    __args = (longdouble *)
             ((long)(this->maxes).super__Vector_base<long_double,_std::allocator<long_double>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar2);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<long_double,_std::allocator<long_double>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<long_double,_std::allocator<long_double>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_double,std::allocator<long_double>>::_M_realloc_insert<long_double_const&>
                ((vector<long_double,std::allocator<long_double>> *)__return_storage_ptr__,
                 __position,__args);
    }
    else {
      *__position._M_current = *__args;
      (__return_storage_ptr__->super__Vector_base<long_double,_std::allocator<long_double>_>).
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar1 = uVar1 + 1;
    lVar2 = lVar2 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<long double> CSVStat::get_maxes() const {
        std::vector<long double> ret;        
        for (size_t i = 0; i < this->get_col_names().size(); i++) {
            ret.push_back(this->maxes[i]);
        }
        return ret;
    }